

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

CollSeq * sqlite3GetCollSeq(Parse *pParse,u8 enc,CollSeq *pColl,char *zName)

{
  byte bVar1;
  sqlite3 *db;
  _func_int_void_ptr_int_void_ptr_int_void_ptr *p_Var2;
  u8 uVar3;
  undefined7 uVar4;
  char *pcVar5;
  Mem *pMem;
  void *pvVar6;
  HashElem *pHVar7;
  CollSeq *pCVar8;
  long lVar9;
  
  db = pParse->db;
  if (pColl == (CollSeq *)0x0) {
    if (zName == (char *)0x0) {
      pColl = db->pDfltColl;
    }
    else {
      pColl = (CollSeq *)0x0;
      pHVar7 = findElementWithHash(&db->aCollSeq,zName,(uint *)0x0);
      if (pHVar7->data != (void *)0x0) {
        pColl = (CollSeq *)((long)pHVar7->data + (ulong)enc * 0x28 + -0x28);
      }
    }
  }
  if ((pColl != (CollSeq *)0x0) &&
     (pColl->xCmp != (_func_int_void_ptr_int_void_ptr_int_void_ptr *)0x0)) goto LAB_0015bc44;
  if (db->xCollNeeded == (_func_void_void_ptr_sqlite3_ptr_int_char_ptr *)0x0) {
LAB_0015bb51:
    if (db->xCollNeeded16 != (_func_void_void_ptr_sqlite3_ptr_int_void_ptr *)0x0) {
      pMem = (Mem *)sqlite3DbMallocZero(db,0x38);
      if (pMem != (Mem *)0x0) {
        pMem->flags = 1;
        pMem->db = db;
        sqlite3VdbeMemSetStr(pMem,zName,-1,'\x01',(_func_void_void_ptr *)0x0);
      }
      pvVar6 = sqlite3ValueText(pMem,'\x02');
      if (pvVar6 != (void *)0x0) {
        (*db->xCollNeeded16)(db->pCollNeededArg,db,(int)db->enc,pvVar6);
      }
      sqlite3ValueFree(pMem);
    }
  }
  else {
    pcVar5 = sqlite3DbStrDup(db,zName);
    if (pcVar5 != (char *)0x0) {
      (*db->xCollNeeded)(db->pCollNeededArg,db,(uint)enc,pcVar5);
      sqlite3DbFreeNN(db,pcVar5);
      goto LAB_0015bb51;
    }
  }
  if (zName == (char *)0x0) {
    pColl = db->pDfltColl;
  }
  else {
    pColl = (CollSeq *)0x0;
    pHVar7 = findElementWithHash(&db->aCollSeq,zName,(uint *)0x0);
    if (pHVar7->data != (void *)0x0) {
      pColl = (CollSeq *)((long)pHVar7->data + (ulong)enc * 0x28 + -0x28);
    }
  }
LAB_0015bc44:
  if (pColl == (CollSeq *)0x0) {
    pColl = (CollSeq *)0x0;
  }
  else if (pColl->xCmp == (_func_int_void_ptr_int_void_ptr_int_void_ptr *)0x0) {
    pcVar5 = pColl->zName;
    lVar9 = 0;
    do {
      if (pcVar5 == (char *)0x0) {
        pCVar8 = db->pDfltColl;
      }
      else {
        bVar1 = (&synthCollSeq_aEnc)[lVar9];
        pHVar7 = findElementWithHash(&db->aCollSeq,pcVar5,(uint *)0x0);
        pCVar8 = (CollSeq *)((long)pHVar7->data + (ulong)bVar1 * 0x28 + -0x28);
      }
      if (pCVar8->xCmp != (_func_int_void_ptr_int_void_ptr_int_void_ptr *)0x0) {
        pColl->xDel = pCVar8->xDel;
        pcVar5 = pCVar8->zName;
        uVar3 = pCVar8->enc;
        uVar4 = *(undefined7 *)&pCVar8->field_0x9;
        p_Var2 = pCVar8->xCmp;
        pColl->pUser = pCVar8->pUser;
        pColl->xCmp = p_Var2;
        pColl->zName = pcVar5;
        pColl->enc = uVar3;
        *(undefined7 *)&pColl->field_0x9 = uVar4;
        pColl->xDel = (_func_void_void_ptr *)0x0;
        goto LAB_0015bcf2;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    pColl = (CollSeq *)0x0;
  }
LAB_0015bcf2:
  if (pColl == (CollSeq *)0x0) {
    sqlite3ErrorMsg(pParse,"no such collation sequence: %s",zName);
    pParse->rc = 0x101;
  }
  return pColl;
}

Assistant:

SQLITE_PRIVATE CollSeq *sqlite3GetCollSeq(
  Parse *pParse,        /* Parsing context */
  u8 enc,               /* The desired encoding for the collating sequence */
  CollSeq *pColl,       /* Collating sequence with native encoding, or NULL */
  const char *zName     /* Collating sequence name */
){
  CollSeq *p;
  sqlite3 *db = pParse->db;

  p = pColl;
  if( !p ){
    p = sqlite3FindCollSeq(db, enc, zName, 0);
  }
  if( !p || !p->xCmp ){
    /* No collation sequence of this type for this encoding is registered.
    ** Call the collation factory to see if it can supply us with one.
    */
    callCollNeeded(db, enc, zName);
    p = sqlite3FindCollSeq(db, enc, zName, 0);
  }
  if( p && !p->xCmp && synthCollSeq(db, p) ){
    p = 0;
  }
  assert( !p || p->xCmp );
  if( p==0 ){
    sqlite3ErrorMsg(pParse, "no such collation sequence: %s", zName);
    pParse->rc = SQLITE_ERROR_MISSING_COLLSEQ;
  }
  return p;
}